

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QByteArray * composePreprocessorOutput(Symbols *symbols)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  int padding;
  Token secondlast;
  Token last;
  int lineNum;
  QByteArray *output;
  Symbol sym;
  int i;
  Symbol *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QByteArray *this;
  int local_a8;
  undefined4 uStack_44;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x12dded);
  local_a8 = 1;
  while (bVar2 = hasNext((Symbols *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (int)((ulong)in_stack_ffffffffffffff28 >> 0x20)), bVar2) {
    next((Symbols *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
         &in_stack_ffffffffffffff28->lineNum);
    Symbol::Symbol((Symbol *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff28);
    uStack_44 = 0xaaaaaaaa;
    iVar3 = -0x55555556 - local_a8;
    if (0 < iVar3) {
      QByteArray::size(in_RDI);
      QByteArray::resize(this,(qsizetype)in_RDI);
      in_stack_ffffffffffffff28 =
           (Symbol *)QByteArray::data((QByteArray *)CONCAT44(uStack_44,in_stack_ffffffffffffff30));
      qVar4 = QByteArray::size(in_RDI);
      memset((char *)((long)in_stack_ffffffffffffff28 + (qVar4 - iVar3)),10,(long)iVar3);
      local_a8 = -0x55555556;
    }
    Symbol::lexem(in_stack_ffffffffffffff28);
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(uStack_44,in_stack_ffffffffffffff30),
               (QByteArray *)in_stack_ffffffffffffff28);
    QByteArray::~QByteArray((QByteArray *)0x12e07f);
    Symbol::~Symbol((Symbol *)0x12e094);
    in_stack_ffffffffffffff34 = uStack_44;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray composePreprocessorOutput(const Symbols &symbols) {
    QByteArray output;
    int lineNum = 1;
    Token last = PP_NOTOKEN;
    Token secondlast = last;
    int i = 0;
    while (hasNext(symbols, i)) {
        Symbol sym = next(symbols, i);
        switch (sym.token) {
        case PP_NEWLINE:
        case PP_WHITESPACE:
            if (last != PP_WHITESPACE) {
                secondlast = last;
                last = PP_WHITESPACE;
                output += ' ';
            }
            continue;
        case PP_STRING_LITERAL:
            if (last == PP_STRING_LITERAL)
                output.chop(1);
            else if (secondlast == PP_STRING_LITERAL && last == PP_WHITESPACE)
                output.chop(2);
            else
                break;
            output += sym.lexem().mid(1);
            secondlast = last;
            last = PP_STRING_LITERAL;
            continue;
        case MOC_INCLUDE_BEGIN:
            lineNum = 0;
            continue;
        case MOC_INCLUDE_END:
            lineNum = sym.lineNum;
            continue;
        default:
            break;
        }
        secondlast = last;
        last = sym.token;

        const int padding = sym.lineNum - lineNum;
        if (padding > 0) {
            output.resize(output.size() + padding);
            memset(output.data() + output.size() - padding, '\n', padding);
            lineNum = sym.lineNum;
        }

        output += sym.lexem();
    }

    return output;
}